

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

void xm_generate_samples(xm_context_t *ctx,float *output,size_t numsamples)

{
  long lVar1;
  xm_channel_context_t *pxVar2;
  xm_instrument_t *pxVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar9;
  ushort uVar10;
  ulong uVar11;
  size_t sVar12;
  xm_pattern_slot_t *pxVar13;
  uint8_t i_1;
  xm_pattern_t *pxVar14;
  uint uVar15;
  uint8_t i_2;
  xm_channel_context_t *pxVar16;
  uint8_t i;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float local_54;
  uint8_t uVar8;
  
  ctx->generated_samples = ctx->generated_samples + numsamples;
  sVar12 = 0;
  do {
    if (sVar12 == numsamples) {
      return;
    }
    fVar18 = ctx->remaining_samples_in_tick;
    if (fVar18 <= 0.0) {
      if (ctx->current_tick == 0) {
        if (ctx->position_jump == true) {
          bVar7 = ctx->jump_dest;
          uVar11 = (ulong)bVar7;
          ctx->current_table_index = bVar7;
          ctx->current_row = ctx->jump_row;
          ctx->position_jump = false;
          ctx->pattern_break = false;
          ctx->jump_row = '\0';
          if ((ctx->module).length <= (ushort)bVar7) {
LAB_001042ae:
            bVar7 = (byte)(ctx->module).restart_position;
            uVar11 = (ulong)bVar7;
            ctx->current_table_index = bVar7;
          }
        }
        else {
          uVar11 = (ulong)ctx->current_table_index;
          if (ctx->pattern_break == true) {
            bVar7 = ctx->current_table_index + 1;
            uVar11 = (ulong)bVar7;
            ctx->current_table_index = bVar7;
            ctx->current_row = ctx->jump_row;
            ctx->pattern_break = false;
            ctx->jump_row = '\0';
            if ((ctx->module).length <= (ushort)bVar7) goto LAB_001042ae;
          }
        }
        bVar7 = (ctx->module).pattern_table[uVar11];
        if ((ushort)bVar7 < (ctx->module).num_patterns) {
          pxVar14 = (ctx->module).patterns + bVar7;
        }
        else {
          pxVar14 = (xm_pattern_t *)0x0;
        }
        uVar11 = 0;
        bVar6 = false;
        while( true ) {
          uVar10 = (ctx->module).num_channels;
          if (uVar10 <= (ushort)uVar11) break;
          if (pxVar14 == (xm_pattern_t *)0x0) {
            pxVar13 = (xm_pattern_slot_t *)&xm_row_empty_slot;
          }
          else {
            pxVar13 = pxVar14->slots + (ulong)ctx->current_row * (ulong)uVar10 + uVar11;
          }
          pxVar16 = ctx->channels + uVar11;
          ctx->channels[uVar11].current = pxVar13;
          if ((pxVar13->effect_type == '\x0e') && ((pxVar13->effect_param & 0xf0) == 0xd0)) {
            pxVar16->note_delay_param = pxVar13->effect_param & 0xf;
          }
          else {
            xm_handle_note_and_instrument(ctx,pxVar16,pxVar13);
          }
          if ((!bVar6) && (pxVar16->pattern_loop_count != '\0')) {
            bVar6 = true;
          }
          uVar11 = (ulong)(byte)((char)uVar11 + 1);
        }
        uVar8 = ctx->current_row;
        if (!bVar6) {
          uVar10 = CONCAT11(ctx->current_table_index,uVar8);
          uVar8 = ctx->row_loop_count[uVar10];
          ctx->row_loop_count[uVar10] = uVar8 + '\x01';
          ctx->loop_count = uVar8;
          uVar8 = ctx->current_row;
        }
        bVar7 = uVar8 + 1;
        ctx->current_row = bVar7;
        if ((ctx->position_jump == false) && (ctx->pattern_break == false)) {
          uVar10 = 0x40;
          if (pxVar14 != (xm_pattern_t *)0x0) {
            uVar10 = pxVar14->num_rows;
          }
          if ((bVar7 == 0) || (uVar10 <= bVar7)) {
            bVar7 = ctx->current_table_index + 1;
            ctx->current_table_index = bVar7;
            ctx->current_row = ctx->jump_row;
            ctx->jump_row = '\0';
            if ((ctx->module).length <= (ushort)bVar7) {
              ctx->current_table_index = (uint8_t)(ctx->module).restart_position;
            }
          }
        }
      }
      for (bVar7 = 0; (ushort)bVar7 < (ctx->module).num_channels; bVar7 = bVar7 + 1) {
        pxVar2 = ctx->channels;
        pxVar16 = pxVar2 + bVar7;
        xm_envelopes(pxVar16);
        pxVar3 = pxVar2[bVar7].instrument;
        if ((pxVar3 == (xm_instrument_t *)0x0) || (pxVar3->vibrato_depth == '\0')) {
          if ((pxVar16->autovibrato_note_offset != 0.0) || (NAN(pxVar16->autovibrato_note_offset)))
          {
            pxVar16->autovibrato_note_offset = 0.0;
            goto LAB_00104501;
          }
        }
        else {
          uVar10 = pxVar16->autovibrato_ticks;
          if (uVar10 < pxVar3->vibrato_sweep) {
            local_54 = (float)uVar10 / (float)(ushort)pxVar3->vibrato_sweep;
          }
          else {
            local_54 = 1.0;
          }
          pxVar16->autovibrato_ticks = uVar10 + 1;
          fVar18 = xm_waveform(pxVar3->vibrato_type,
                               (uint8_t)((uint)pxVar3->vibrato_rate * (uint)uVar10 >> 2));
          pxVar16->autovibrato_note_offset =
               (((float)pxVar3->vibrato_depth * fVar18 * 0.25) / 15.0) * local_54;
LAB_00104501:
          xm_update_frequency(ctx,pxVar16);
        }
        if ((pxVar16->arp_in_progress == true) &&
           ((pxVar16->current->effect_type != '\0' || (pxVar16->current->effect_param == '\0')))) {
          pxVar16->arp_in_progress = false;
          pxVar16->arp_note_offset = '\0';
          xm_update_frequency(ctx,pxVar16);
        }
        if (((pxVar16->vibrato_in_progress == true) && ((pxVar16->current->effect_type | 2) != 6))
           && ((pxVar16->current->volume_column & 0xf0) != 0xb0)) {
          pxVar16->vibrato_in_progress = false;
          pxVar16->vibrato_note_offset = 0.0;
          xm_update_frequency(ctx,pxVar16);
        }
        bVar9 = pxVar16->current->volume_column;
        switch(bVar9 >> 4) {
        case 6:
          if (ctx->current_tick != 0) {
            bVar9 = bVar9 & 0xf;
LAB_001045f1:
            xm_volume_slide(pxVar16,bVar9);
          }
          break;
        case 7:
          if (ctx->current_tick != 0) {
            bVar9 = bVar9 << 4;
            goto LAB_001045f1;
          }
          break;
        case 0xb:
          if (ctx->current_tick != 0) {
            pxVar16->vibrato_in_progress = false;
            xm_vibrato(ctx,pxVar16,pxVar16->vibrato_param);
          }
          break;
        case 0xd:
          if (ctx->current_tick != 0) {
            bVar9 = bVar9 & 0xf;
LAB_0010461b:
            xm_panning_slide(pxVar16,bVar9);
          }
          break;
        case 0xe:
          if (ctx->current_tick != 0) {
            bVar9 = bVar9 << 4;
            goto LAB_0010461b;
          }
          break;
        case 0xf:
          if (ctx->current_tick != 0) {
            xm_tone_portamento(ctx,pxVar16);
          }
        }
        pxVar13 = pxVar16->current;
        switch(pxVar13->effect_type) {
        case '\0':
          bVar9 = pxVar13->effect_param;
          if (bVar9 != 0) {
            uVar15 = (uint)ctx->tempo % 3;
            if ((short)uVar15 == 2) {
              uVar10 = ctx->current_tick;
              if (uVar10 != 1) goto LAB_00104a19;
LAB_00104a4d:
              pxVar16->arp_in_progress = true;
              bVar9 = bVar9 >> 4;
LAB_00104a90:
              pxVar16->arp_note_offset = bVar9;
            }
            else {
              if (uVar15 != 1) {
                uVar10 = ctx->current_tick;
LAB_00104a2e:
                uVar15 = (uVar10 - uVar15 & 0xffff) % 3;
                if ((short)uVar15 == 2) goto LAB_00104a4d;
                if (uVar15 == 1) {
                  pxVar16->arp_in_progress = true;
                  bVar9 = bVar9 & 0xf;
                }
                else {
                  pxVar16->arp_in_progress = false;
                  bVar9 = 0;
                }
                goto LAB_00104a90;
              }
              uVar10 = ctx->current_tick;
LAB_00104a19:
              if (uVar10 != 0) goto LAB_00104a2e;
              pxVar16->arp_in_progress = false;
              pxVar16->arp_note_offset = '\0';
            }
            xm_update_frequency(ctx,pxVar16);
          }
          break;
        case '\x01':
          if (ctx->current_tick != 0) {
            uVar15 = -(uint)pxVar16->portamento_up_param;
LAB_00104825:
            xm_pitch_slide(ctx,pxVar16,(float)(int)uVar15);
          }
          break;
        case '\x02':
          if (ctx->current_tick != 0) {
            uVar15 = (uint)pxVar16->portamento_down_param;
            goto LAB_00104825;
          }
          break;
        case '\x03':
          if (ctx->current_tick != 0) {
            xm_tone_portamento(ctx,pxVar16);
          }
          break;
        case '\x04':
          if (ctx->current_tick != 0) {
            pxVar16->vibrato_in_progress = true;
            xm_vibrato(ctx,pxVar16,pxVar16->vibrato_param);
          }
          break;
        case '\x05':
          if (ctx->current_tick != 0) {
            xm_tone_portamento(ctx,pxVar16);
LAB_001049b1:
            xm_volume_slide(pxVar16,pxVar16->volume_slide_param);
          }
          break;
        case '\x06':
          if (ctx->current_tick != 0) {
            pxVar16->vibrato_in_progress = true;
            xm_vibrato(ctx,pxVar16,pxVar16->vibrato_param);
            goto LAB_001049b1;
          }
          break;
        case '\a':
          if (ctx->current_tick != 0) {
            bVar9 = pxVar16->tremolo_param;
            uVar8 = pxVar16->tremolo_ticks;
            pxVar16->tremolo_ticks = uVar8 + '\x01';
            fVar18 = xm_waveform(pxVar16->tremolo_waveform,(bVar9 >> 4) * uVar8);
            pxVar16->tremolo_volume = ((float)(bVar9 & 0xf) * fVar18) / -15.0;
          }
          break;
        case '\n':
          if (ctx->current_tick != 0) goto LAB_001049b1;
          break;
        case '\x0e':
          bVar9 = pxVar13->effect_param;
          bVar5 = bVar9 >> 4;
          if (bVar5 == 0xd) {
            if (ctx->current_tick == (ushort)pxVar16->note_delay_param) {
              xm_handle_note_and_instrument(ctx,pxVar16,pxVar13);
LAB_001049fe:
              xm_envelopes(pxVar16);
            }
          }
          else if (bVar5 == 0xc) {
            if ((bVar9 & 0xf) == ctx->current_tick) goto LAB_001049d6;
          }
          else if ((((bVar5 == 9) && (ctx->current_tick != 0)) && ((bVar9 & 0xf) != 0)) &&
                  ((short)((uint)ctx->current_tick % (bVar9 & 0xf)) == 0)) {
            xm_trigger_note(ctx,pxVar16,1);
            goto LAB_001049fe;
          }
          break;
        case '\x11':
          if ((ctx->current_tick != 0) &&
             (bVar9 = pxVar16->global_volume_slide_param, bVar9 < 0x10 || (bVar9 & 0xf) == 0)) {
            if (bVar9 < 0x10) {
              fVar19 = (float)(int)(char)bVar9 * -0.015625 + ctx->global_volume;
              fVar18 = 0.0;
              if (0.0 <= fVar19) {
                fVar18 = fVar19;
              }
            }
            else {
              fVar19 = (float)(bVar9 >> 4) * 0.015625 + ctx->global_volume;
              fVar18 = 1.0;
              if (fVar19 <= 1.0) {
                fVar18 = fVar19;
              }
            }
            ctx->global_volume = fVar18;
          }
          break;
        case '\x14':
          if (ctx->current_tick == (ushort)pxVar13->effect_param) {
            pxVar16->sustained = false;
            if ((pxVar16->instrument == (xm_instrument_t *)0x0) ||
               ((pxVar16->instrument->volume_envelope).enabled == false)) {
LAB_001049d6:
              pxVar16->volume = 0.0;
            }
          }
          break;
        case '\x19':
          if (ctx->current_tick != 0) {
            xm_panning_slide(pxVar16,pxVar16->panning_slide_param);
          }
          break;
        case '\x1b':
          if (((ctx->current_tick != 0) && ((pxVar16->multi_retrig_param & 0xf) != 0)) &&
             (((short)((uint)ctx->current_tick % (pxVar16->multi_retrig_param & 0xf)) == 0 &&
              ((xm_trigger_note(ctx,pxVar16,9), pxVar16->current->volume_column == '\0' &&
               ((pxVar16->instrument->volume_envelope).enabled == false)))))) {
            bVar9 = pxVar16->multi_retrig_param >> 4;
            fVar19 = pxVar16->volume * multi_retrig_multiply[bVar9] +
                     multi_retrig_add[bVar9] * 0.015625;
            fVar18 = 1.0;
            if ((fVar19 <= 1.0) && (fVar18 = fVar19, fVar19 < 0.0)) {
              fVar18 = 0.0;
            }
            pxVar16->volume = fVar18;
          }
          break;
        case '\x1d':
          if (ctx->current_tick != 0) {
            uVar15 = (uint)(pxVar16->tremor_param >> 4);
            pxVar16->tremor_on =
                 uVar15 < (ctx->current_tick - 1 & 0xffff) %
                          ((pxVar16->tremor_param & 0xf) + uVar15 + 2);
          }
        }
        fVar18 = 0.0;
        if (pxVar16->tremor_on == false) {
          fVar19 = pxVar16->volume + pxVar16->tremolo_volume;
          fVar18 = 1.0;
          if ((fVar19 <= 1.0) && (fVar18 = fVar19, fVar19 < 0.0)) {
            fVar18 = 0.0;
          }
          fVar18 = pxVar16->fadeout_volume * pxVar16->volume_envelope_volume * fVar18;
        }
        fVar19 = (pxVar16->panning_envelope_panning + -0.5) * (0.5 - ABS(pxVar16->panning + -0.5));
        fVar20 = fVar19 + fVar19 + pxVar16->panning;
        fVar19 = 1.0 - fVar20;
        if (fVar19 < 0.0) {
          fVar19 = sqrtf(fVar19);
        }
        else {
          fVar19 = SQRT(fVar19);
        }
        pxVar16->target_volume[0] = fVar19 * fVar18;
        if (fVar20 < 0.0) {
          fVar20 = sqrtf(fVar20);
        }
        else {
          fVar20 = SQRT(fVar20);
        }
        pxVar16->target_volume[1] = fVar18 * fVar20;
      }
      uVar10 = ctx->current_tick + 1;
      ctx->current_tick = uVar10;
      if ((uint)ctx->extra_ticks + (uint)ctx->tempo <= (uint)uVar10) {
        ctx->current_tick = 0;
        ctx->extra_ticks = 0;
      }
      fVar18 = (float)ctx->rate / ((float)ctx->bpm * 0.4) + ctx->remaining_samples_in_tick;
    }
    ctx->remaining_samples_in_tick = fVar18 + -1.0;
    (output + sVar12 * 2)[0] = 0.0;
    (output + sVar12 * 2)[1] = 0.0;
    if ((ctx->max_loop_count == 0) || (ctx->loop_count < ctx->max_loop_count)) {
      lVar1 = sVar12 * 2 + 1;
      for (uVar11 = 0; (ushort)uVar11 < (ctx->module).num_channels;
          uVar11 = (ulong)(byte)((char)uVar11 + 1)) {
        if (((ctx->channels[uVar11].instrument != (xm_instrument_t *)0x0) &&
            (pxVar16 = ctx->channels + uVar11, pxVar16->sample != (xm_sample_t *)0x0)) &&
           (0.0 < pxVar16->sample_position || pxVar16->sample_position == 0.0)) {
          fVar18 = xm_next_of_sample(pxVar16);
          if ((pxVar16->muted == false) && (pxVar16->instrument->muted == false)) {
            output[sVar12 * 2] = pxVar16->actual_volume[0] * fVar18 + output[sVar12 * 2];
            output[lVar1] = fVar18 * pxVar16->actual_volume[1] + output[lVar1];
          }
          pxVar16->frame_count = pxVar16->frame_count + 1;
          fVar18 = pxVar16->target_volume[0];
          fVar19 = pxVar16->actual_volume[0];
          if (fVar19 <= fVar18) {
            if ((fVar19 < fVar18) &&
               (fVar19 = fVar19 + ctx->volume_ramp, pxVar16->actual_volume[0] = fVar19,
               fVar18 < fVar19)) goto LAB_00104d37;
          }
          else {
            fVar19 = fVar19 - ctx->volume_ramp;
            pxVar16->actual_volume[0] = fVar19;
            if (fVar19 < fVar18) {
LAB_00104d37:
              pxVar16->actual_volume[0] = fVar18;
            }
          }
          fVar18 = pxVar16->target_volume[1];
          fVar19 = pxVar16->actual_volume[1];
          if (fVar19 <= fVar18) {
            if ((fVar19 < fVar18) &&
               (fVar19 = fVar19 + ctx->volume_ramp, pxVar16->actual_volume[1] = fVar19,
               fVar18 < fVar19)) goto LAB_00104d8c;
          }
          else {
            fVar19 = fVar19 - ctx->volume_ramp;
            pxVar16->actual_volume[1] = fVar19;
            if (fVar19 < fVar18) {
LAB_00104d8c:
              pxVar16->actual_volume[1] = fVar18;
            }
          }
        }
      }
      fVar18 = ctx->global_volume * ctx->amplification;
      fVar19 = fVar18 * (float)*(undefined8 *)(output + sVar12 * 2);
      fVar18 = fVar18 * (float)((ulong)*(undefined8 *)(output + sVar12 * 2) >> 0x20);
      *(ulong *)(output + sVar12 * 2) = CONCAT44(fVar18,fVar19);
      iVar17 = -(uint)(1.0 < ABS(fVar18));
      auVar4._4_4_ = -(uint)(1.0 < ABS(fVar19));
      auVar4._0_4_ = -(uint)(1.0 < ABS(fVar19));
      auVar4._8_4_ = iVar17;
      auVar4._12_4_ = iVar17;
      iVar17 = movmskpd((int)output,auVar4);
      if (iVar17 != 0) {
        fprintf(_stderr,"%s(): clipping frame: %f %f, this is a bad module or a libxm bug\n",
                (double)fVar19,"xm_sample");
        fflush(_stderr);
      }
    }
    sVar12 = sVar12 + 1;
  } while( true );
}

Assistant:

void xm_generate_samples(xm_context_t* ctx, float* output, size_t numsamples) {
	ctx->generated_samples += numsamples;

	for(size_t i = 0; i < numsamples; i++) {
		xm_sample(ctx, output + (2 * i), output + (2 * i + 1));
	}
}